

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_sync_handler_failed_default_exception_branch
          (t_rs_generator *this,t_function *tfunc)

{
  t_function *tfunc_00;
  bool bVar1;
  ostream *poVar2;
  allocator local_121;
  string local_120;
  string local_100;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  string local_38;
  t_function *local_18;
  t_function *tfunc_local;
  t_rs_generator *this_local;
  
  local_18 = tfunc;
  tfunc_local = (t_function *)this;
  t_generator::indent_abi_cxx11_(&local_38,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_38);
  poVar2 = std::operator<<(poVar2,"let ret_err = {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  t_generator::indent_up(&this->super_t_generator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"ApplicationError",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"ApplicationErrorKind::Unknown",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"e.to_string()",&local_b9);
  render_thrift_error_struct(this,&local_68,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_e0,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_e0);
  poVar2 = std::operator<<(poVar2,"};");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = t_function::is_oneway(local_18);
  tfunc_00 = local_18;
  if (bVar1) {
    t_generator::indent_abi_cxx11_(&local_100,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_100);
    poVar2 = std::operator<<(poVar2,"Err(thrift::Error::Application(ret_err))");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"ret_err",&local_121);
    render_sync_handler_send_exception_response(this,tfunc_00,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  return;
}

Assistant:

void t_rs_generator::render_sync_handler_failed_default_exception_branch(t_function *tfunc) {
  f_gen_ << indent() << "let ret_err = {" << endl;
  indent_up();
  render_thrift_error_struct("ApplicationError", "ApplicationErrorKind::Unknown", "e.to_string()");
  indent_down();
  f_gen_ << indent() << "};" << endl;
  if (tfunc->is_oneway()) {
    f_gen_ << indent() << "Err(thrift::Error::Application(ret_err))" << endl;
  } else {
    render_sync_handler_send_exception_response(tfunc, "ret_err");
  }
}